

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O2

double * inform_local_relative_entropy(int *xs,int *ys,size_t n,int b,double *re,inform_error *err)

{
  inform_dist *piVar1;
  inform_dist *piVar2;
  _Bool _Var3;
  double *__ptr;
  size_t i;
  long lVar4;
  double dVar5;
  inform_dist *y;
  inform_dist *x;
  inform_dist *local_48;
  inform_dist *local_40;
  int *local_38;
  
  _Var3 = check_arguments(xs,ys,n,b,err);
  if (!_Var3) {
    __ptr = re;
    local_38 = ys;
    if ((re == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      local_40 = (inform_dist *)0x0;
      local_48 = (inform_dist *)0x0;
      _Var3 = allocate(b,&local_40,&local_48,err);
      piVar2 = local_40;
      piVar1 = local_48;
      if (!_Var3) {
        accumulate(xs,local_38,n,local_40,local_48);
        for (lVar4 = 0; b != lVar4; lVar4 = lVar4 + 1) {
          dVar5 = log2((double)piVar2->histogram[lVar4] / (double)piVar1->histogram[lVar4]);
          __ptr[lVar4] = dVar5;
        }
        free_all(&local_40,&local_48);
        return __ptr;
      }
      if (re == (double *)0x0) {
        free(__ptr);
      }
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_relative_entropy(int const *xs, int const *ys, size_t n,
    int b, double *re, inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NULL;

    bool allocate_re = (re == NULL);
    if (allocate_re)
    {
        re = malloc(n * sizeof(double));
        if (re == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err))
    {
        if (allocate_re) free(re);
        return NULL;
    }

    accumulate(xs, ys, n, x, y);

    double p, q;
    for (size_t i = 0; i < (size_t) b; ++i)
    {
        p = x->histogram[i];
        q = y->histogram[i];
        re[i] = log2(p / q);
    }

    free_all(&x, &y);

    return re;
}